

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O3

iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
burst::algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>::
find_first<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_begin,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_end,bitmask_type *hint)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  uint uVar7;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  iVar8;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar9;
  _WordT _Var3;
  
  if (corpus_begin._M_current == corpus_end._M_current) {
    uVar4 = *(long *)(*(long *)this + 0x800) - 1;
    uVar7 = 0;
    if (uVar4 < 0x20) {
      uVar7 = (uint)(1L << ((byte)uVar4 & 0x3f));
    }
    _Var3 = (hint->super__Base_bitset<1UL>)._M_w;
    uVar2 = (uint)_Var3;
    _Var6._M_current = corpus_begin._M_current;
    _Var5._M_current = corpus_begin._M_current;
    if (corpus_begin._M_current != corpus_end._M_current) {
      do {
        _Var6._M_current = _Var5._M_current;
        uVar2 = (uint)_Var3;
        if ((uVar2 & uVar7) != 0) break;
        uVar2 = uVar2 * 2 + 1 & *(uint *)(*(long *)this + (ulong)(byte)*corpus_begin._M_current * 8)
        ;
        _Var3 = (_WordT)uVar2;
        (hint->super__Base_bitset<1UL>)._M_w = _Var3;
        corpus_begin._M_current = corpus_begin._M_current + 1;
        _Var5._M_current = _Var6._M_current + 1;
        _Var6._M_current = corpus_end._M_current;
      } while (corpus_begin._M_current != corpus_end._M_current);
    }
    if ((uVar2 & uVar7) == 0) {
      corpus_begin._M_current = corpus_end._M_current;
      _Var6._M_current = corpus_end._M_current;
    }
    iVar9.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_End._M_current = corpus_begin._M_current;
    iVar9.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_current = _Var6._M_current;
    return (iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )iVar9.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
    ;
  }
  uVar4 = 0;
  do {
    if (*(ulong *)(*(long *)this + 0x800) <= uVar4) break;
    pbVar1 = (byte *)(corpus_begin._M_current + uVar4);
    (hint->super__Base_bitset<1UL>)._M_w =
         (ulong)((int)(hint->super__Base_bitset<1UL>)._M_w * 2 + 1U &
                *(uint *)(*(long *)this + (ulong)*pbVar1 * 8));
    uVar4 = uVar4 + 1;
  } while (pbVar1 + 1 != (byte *)corpus_end._M_current);
  iVar8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
       = (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          )active_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                     (this,corpus_begin,
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(corpus_begin._M_current + uVar4),corpus_end,hint);
  return (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          )(iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
            )iVar8.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

boost::iterator_range<ForwardIterator>
                find_first
                (
                    ForwardIterator corpus_begin,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                return
                    active_search
                    (
                        corpus_begin,
                        dummy_search(corpus_begin, corpus_end, hint),
                        corpus_end,
                        hint
                    );
            }